

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O0

UDate __thiscall icu_63::DateFormat::parse(DateFormat *this,UnicodeString *text,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  UDate result;
  ParsePosition pos;
  UErrorCode *status_local;
  UnicodeString *text_local;
  DateFormat *this_local;
  
  pos._8_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    ParsePosition::ParsePosition((ParsePosition *)&result,0);
    this_local = (DateFormat *)parse(this,text,(ParsePosition *)&result);
    iVar2 = ParsePosition::getIndex((ParsePosition *)&result);
    if (iVar2 == 0) {
      *(undefined4 *)pos._8_8_ = 1;
    }
    ParsePosition::~ParsePosition((ParsePosition *)&result);
  }
  else {
    this_local = (DateFormat *)0x0;
  }
  return (UDate)this_local;
}

Assistant:

UDate
DateFormat::parse(const UnicodeString& text,
                  UErrorCode& status) const
{
    if (U_FAILURE(status)) return 0;

    ParsePosition pos(0);
    UDate result = parse(text, pos);
    if (pos.getIndex() == 0) {
#if defined (U_DEBUG_CAL)
      fprintf(stderr, "%s:%d - - failed to parse  - err index %d\n"
              , __FILE__, __LINE__, pos.getErrorIndex() );
#endif
      status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return result;
}